

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

int linenoiseEditInsert(linenoiseState *l,char c)

{
  size_t sVar1;
  ssize_t sVar2;
  size_t __n;
  char *__src;
  char local_19 [8];
  char c_local;
  
  if (l->len < l->buflen) {
    __src = l->buf + l->pos;
    __n = l->len - l->pos;
    local_19[0] = c;
    if (__n == 0) {
      *__src = c;
      l->pos = l->pos + 1;
      sVar1 = l->len;
      l->len = sVar1 + 1;
      l->buf[sVar1 + 1] = '\0';
      if ((mlmode == 0) && (l->len + l->plen < l->cols)) {
        sVar2 = write(l->ofd,local_19,1);
        if (sVar2 != -1) {
          return 0;
        }
        return -1;
      }
    }
    else {
      memmove(__src + 1,__src,__n);
      l->buf[l->pos] = c;
      sVar1 = l->len;
      l->len = sVar1 + 1;
      l->pos = l->pos + 1;
      l->buf[sVar1 + 1] = '\0';
    }
    linenoiseRefreshLine();
  }
  return 0;
}

Assistant:

int linenoiseEditInsert(struct linenoiseState *l, char c) {
    if (l->len < l->buflen) {
        if (l->len == l->pos) {
            l->buf[l->pos] = c;
            l->pos++;
            l->len++;
            l->buf[l->len] = '\0';
            if ((!mlmode && l->plen+l->len < l->cols) /* || mlmode */) {
                /* Avoid a full update of the line in the
                 * trivial case. */
                if (write(l->ofd,&c,1) == -1) return -1;
            } else {
                linenoiseRefreshLine();
            }
        } else {
            memmove(l->buf+l->pos+1,l->buf+l->pos,l->len-l->pos);
            l->buf[l->pos] = c;
            l->len++;
            l->pos++;
            l->buf[l->len] = '\0';
            linenoiseRefreshLine();
        }
    }
    return 0;
}